

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupport_c_NoExceptionsAreThrownWhenAMock_cCallFailed_TestShell::
TEST_MockSupport_c_NoExceptionsAreThrownWhenAMock_cCallFailed_TestShell
          (TEST_MockSupport_c_NoExceptionsAreThrownWhenAMock_cCallFailed_TestShell *this)

{
  TEST_MockSupport_c_NoExceptionsAreThrownWhenAMock_cCallFailed_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &PTR__TEST_MockSupport_c_NoExceptionsAreThrownWhenAMock_cCallFailed_TestShell_003532d8;
  return;
}

Assistant:

MSC_SWITCHED_TEST(MockSupport_c, NoExceptionsAreThrownWhenAMock_cCallFailed)
{
    TestTestingFixture fixture;

    fixture.setTestFunction(failedCallToMockC);
    fixture.runAllTests();

    LONGS_EQUAL(1, fixture.getFailureCount());
    // Odd behavior in Visual C++, destructor still gets called here
    CHECK(!destructorWasCalled);
}